

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O0

void __thiscall
Saturation::ExtensionalityClauseContainer::print(ExtensionalityClauseContainer *this,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RSI;
  ExtensionalityClause c;
  Iterator it;
  ExtensionalityClauseList *l;
  Iterator cbs;
  Literal *in_stack_00000188;
  Clause *in_stack_00000708;
  DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff18;
  ostream *in_stack_ffffffffffffff20;
  string local_a0 [16];
  TermList *in_stack_ffffffffffffff70;
  ostream *in_stack_ffffffffffffff78;
  string local_70 [56];
  Iterator local_38;
  List<Saturation::ExtensionalityClause> *local_30;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,"#####################");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Lib::
  DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::Iterator::Iterator((Iterator *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  while (bVar1 = Lib::
                 DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::Iterator::hasNext((Iterator *)0xac4356), bVar1) {
    local_30 = Lib::
               DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::Iterator::next((Iterator *)0xac436c);
    Lib::List<Saturation::ExtensionalityClause>::Iterator::Iterator(&local_38,local_30);
    while (bVar1 = Lib::List<Saturation::ExtensionalityClause>::Iterator::hasNext
                             ((Iterator *)0xac4396), bVar1) {
      Lib::List<Saturation::ExtensionalityClause>::Iterator::next
                ((Iterator *)in_stack_ffffffffffffff20);
      poVar2 = local_10;
      Kernel::Clause::toString_abi_cxx11_(in_stack_00000708);
      poVar2 = std::operator<<(poVar2,local_70);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Kernel::Literal::toString_abi_cxx11_(in_stack_00000188);
      poVar2 = std::operator<<(poVar2,local_a0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      in_stack_ffffffffffffff20 =
           Kernel::operator<<(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::ostream::operator<<(in_stack_ffffffffffffff20,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_70);
    }
  }
  poVar2 = std::operator<<(local_10,"#####################");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ExtensionalityClauseContainer::print (std::ostream& out) {
  out << "#####################" << endl;

  ClausesBySort::Iterator cbs(_clausesBySort);

  while(cbs.hasNext()){
    ExtensionalityClauseList* l = cbs.next();
    ExtensionalityClauseList::Iterator it(l);
    while(it.hasNext()) {
      ExtensionalityClause c = it.next();
      out << c.clause->toString() << endl
          << c.literal->toString() << endl
          << c.sort << endl;
    }
  }
  
  out << "#####################" << endl;
}